

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauGia.c
# Opt level: O3

int Dau_DsdToGia_rec(Gia_Man_t *pGia,char *pStr,char **p,int *pMatches,int *pLits,Vec_Int_t *vCover)

{
  Gia_Obj_t *pGVar1;
  byte bVar2;
  Gia_Obj_t *pGVar3;
  Vec_Int_t *pVVar4;
  byte *pbVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  byte *pbVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  char *pcVar14;
  Gia_Obj_t *pGVar15;
  ulong uVar16;
  long lVar17;
  char *pcVar18;
  uint uVar19;
  byte *pbVar20;
  ulong uVar21;
  int iVar22;
  bool bVar23;
  int Temp [3];
  Vec_Int_t vLeaves;
  int pFans [12];
  int local_278 [12];
  Vec_Int_t local_248;
  word local_238 [65];
  
  pbVar20 = (byte *)*p;
  bVar2 = *pbVar20;
  bVar6 = bVar2;
  if (bVar2 == 0x21) {
    *p = (char *)(pbVar20 + 1);
    pbVar10 = pbVar20 + 1;
    pbVar20 = pbVar20 + 1;
    bVar6 = *pbVar10;
  }
  if ((byte)(bVar6 + 0x9f) < 0xc) {
    uVar8 = pLits[(ulong)bVar6 - 0x61];
  }
  else if (bVar6 == 0x5b) {
    if (pStr[pMatches[(long)pbVar20 - (long)pStr]] != ']') {
      __assert_fail("**p == \'[\' && *q == \']\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                    ,0x123,
                    "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)")
      ;
    }
    pbVar10 = (byte *)(pStr + pMatches[(long)pbVar20 - (long)pStr]);
    *p = (char *)(pbVar20 + 1);
    iVar22 = 0;
    if (pbVar20 + 1 < pbVar10) {
      iVar12 = 0;
      do {
        iVar7 = Dau_DsdToGia_rec(pGia,pStr,p,pMatches,pLits,vCover);
        iVar22 = iVar12 + 1;
        Dau_DsdAddToArray(pGia,(int *)local_238,iVar12,iVar7);
        pcVar18 = *p;
        *p = pcVar18 + 1;
        iVar12 = iVar22;
      } while (pcVar18 + 1 < pbVar10);
    }
    uVar8 = Dau_DsdBalance(pGia,(int *)local_238,iVar22,0);
    if ((byte *)*p != pbVar10) {
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                    ,0x12a,
                    "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)")
      ;
    }
  }
  else {
    if (bVar6 == 0x3c) {
      lVar17 = (long)pMatches[(long)pbVar20 - (long)pStr];
      uVar8 = 0;
      if (pStr[lVar17 + 1] == '{') {
        pcVar18 = pStr + lVar17 + 1;
        *p = pcVar18;
        if ((*pcVar18 != '{') ||
           (pcVar18 = pStr + pMatches[(long)pcVar18 - (long)pStr], *pcVar18 != '}')) {
          __assert_fail("**p == \'{\' && *q2 == \'}\'",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                        ,0x13b,
                        "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                       );
        }
        pcVar14 = pStr + lVar17 + 2;
        *p = pcVar14;
        lVar17 = 0;
        if (pcVar14 < pcVar18) {
          lVar17 = 0;
          do {
            iVar22 = Dau_DsdToGia_rec(pGia,pStr,p,pMatches,pLits,vCover);
            *(int *)((long)local_238 + lVar17 * 4) = iVar22;
            pcVar14 = *p + 1;
            *p = pcVar14;
            lVar17 = lVar17 + 1;
          } while (pcVar14 < pcVar18);
        }
        uVar8 = (uint)lVar17;
        if (pcVar14 != pcVar18) {
          __assert_fail("*p == q2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                        ,0x13e,
                        "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                       );
        }
        lVar17 = (long)pMatches[(long)pbVar20 - (long)pStr];
        pLits = (int *)local_238;
      }
      *p = (char *)pbVar20;
      if ((*pbVar20 != 0x3c) || (pbVar10 = (byte *)(pStr + lVar17), *pbVar10 != 0x3e)) {
        __assert_fail("**p == \'<\' && *q == \'>\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                      ,0x146,
                      "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      pbVar5 = pbVar20;
      if (uVar8 != 0) {
        for (; pbVar5 < pbVar10; pbVar5 = pbVar5 + 1) {
          if (((byte)(*pbVar5 + 0x9f) < 0x1a) && (uVar8 <= (byte)(*pbVar5 + 0x9f))) {
            __assert_fail("*pOld - \'a\' < nVars",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                          ,0x14b,
                          "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                         );
          }
        }
      }
      *p = (char *)(pbVar20 + 1);
      if (pbVar10 <= pbVar20 + 1) {
LAB_004a70c6:
        __assert_fail("pTemp == Temp + 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                      ,0x14f,
                      "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      lVar17 = 0;
      do {
        iVar22 = Dau_DsdToGia_rec(pGia,pStr,p,pMatches,pLits,vCover);
        *(int *)((long)local_278 + lVar17) = iVar22;
        lVar17 = lVar17 + 4;
        pcVar18 = *p;
        pbVar20 = (byte *)(pcVar18 + 1);
        *p = (char *)pbVar20;
      } while (pbVar20 < pbVar10);
      if (lVar17 != 0xc) goto LAB_004a70c6;
      if (pbVar20 != pbVar10) {
        __assert_fail("*p == q",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                      ,0x150,
                      "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      if (pbVar10[1] == 0x7b) {
        *p = pcVar18 + 2;
        if ((pcVar18[2] != '{') || (pStr[pMatches[(long)(pcVar18 + 2) - (long)pStr]] != '}')) {
          __assert_fail("**p == \'{\' && *q == \'}\'",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                        ,0x154,
                        "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                       );
        }
        *p = pStr + pMatches[(long)(pcVar18 + 2) - (long)pStr];
      }
      if (pGia->pMuxes == (uint *)0x0) {
        uVar8 = Gia_ManHashMux(pGia,local_278[0],local_278[1],local_278[2]);
      }
      else {
        uVar8 = Gia_ManHashMuxReal(pGia,local_278[0],local_278[1],local_278[2]);
      }
      if ((int)uVar8 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10c,"int Abc_Lit2Var(int)");
      }
      uVar9 = uVar8 >> 1;
      if (pGia->nObjs <= (int)uVar9) {
LAB_004a6fce:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar21 = *(ulong *)(pGia->pObjs + uVar9);
      uVar16 = uVar21 & 0x1fffffff;
      if (uVar16 != 0x1fffffff && -1 < (int)uVar21) {
        pGVar1 = pGia->pObjs + uVar9;
        if (pGia->pMuxes == (uint *)0x0) {
          if ((~*(uint *)(pGVar1 + -uVar16) & 0x1fffffff) != 0 &&
              -1 < (int)*(uint *)(pGVar1 + -uVar16)) {
            Gia_ObjSetAndLevel(pGia,pGVar1 + -uVar16);
            uVar21 = *(ulong *)pGVar1;
          }
          uVar21 = (ulong)((uint)(uVar21 >> 0x20) & 0x1fffffff);
          if ((~*(uint *)(pGVar1 + -uVar21) & 0x1fffffff) != 0 &&
              -1 < (int)*(uint *)(pGVar1 + -uVar21)) {
            Gia_ObjSetAndLevel(pGia,pGVar1 + -uVar21);
          }
          Gia_ObjSetAndLevel(pGia,pGVar1);
        }
        else {
          Gia_ObjSetMuxLevel(pGia,pGVar1);
        }
      }
      goto LAB_004a6eba;
    }
    if (bVar6 == 0x28) {
      if (pStr[pMatches[(long)pbVar20 - (long)pStr]] != ')') {
        __assert_fail("**p == \'(\' && *q == \')\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                      ,0x115,
                      "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      pbVar10 = (byte *)(pStr + pMatches[(long)pbVar20 - (long)pStr]);
      *p = (char *)(pbVar20 + 1);
      iVar22 = 0;
      if (pbVar20 + 1 < pbVar10) {
        iVar12 = 0;
        do {
          iVar7 = Dau_DsdToGia_rec(pGia,pStr,p,pMatches,pLits,vCover);
          iVar22 = iVar12 + 1;
          Dau_DsdAddToArray(pGia,(int *)local_238,iVar12,iVar7);
          pcVar18 = *p;
          *p = pcVar18 + 1;
          iVar12 = iVar22;
        } while (pcVar18 + 1 < pbVar10);
      }
      uVar8 = Dau_DsdBalance(pGia,(int *)local_238,iVar22,1);
      if ((byte *)*p != pbVar10) {
        __assert_fail("*p == q",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                      ,0x11c,
                      "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
    }
    else {
      if (5 < (byte)(bVar6 + 0xbf) && 9 < (byte)(bVar6 - 0x30)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                      ,0x184,
                      "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      iVar22 = Abc_TtReadHex(local_238,(char *)pbVar20);
      iVar12 = 1 << ((char)iVar22 - 2U & 0x1f);
      if (iVar22 < 3) {
        iVar12 = 1;
      }
      pcVar14 = *p;
      pcVar18 = pcVar14 + iVar12;
      *p = pcVar18;
      if ((pcVar14[iVar12] != '{') ||
         (pcVar14 = pStr + pMatches[(long)pcVar18 - (long)pStr], *pcVar14 != '}')) {
        __assert_fail("**p == \'{\' && *q == \'}\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                      ,0x173,
                      "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      pcVar18 = pcVar18 + 1;
      *p = pcVar18;
      lVar17 = 0;
      if (pcVar18 < pcVar14) {
        lVar17 = 0;
        do {
          iVar12 = Dau_DsdToGia_rec(pGia,pStr,p,pMatches,pLits,vCover);
          local_278[lVar17] = iVar12;
          pcVar18 = *p + 1;
          *p = pcVar18;
          lVar17 = lVar17 + 1;
        } while (pcVar18 < pcVar14);
      }
      if ((int)lVar17 != iVar22) {
        __assert_fail("i == nVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                      ,0x176,
                      "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      if (pcVar18 != pcVar14) {
        __assert_fail("*p == q",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                      ,0x177,
                      "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      local_248.pArray = local_278;
      uVar9 = pGia->nObjs;
      uVar21 = (ulong)uVar9;
      local_248.nCap = iVar22;
      local_248.nSize = iVar22;
      uVar8 = Kit_TruthToGia(pGia,(uint *)local_238,iVar22,vCover,&local_248,1);
      iVar22 = pGia->nObjs;
      if ((int)uVar9 < iVar22) {
        lVar17 = uVar21 * 0xc;
        do {
          if ((int)uVar9 < 0) goto LAB_004a6fce;
          pGVar3 = pGia->pObjs;
          pGVar1 = (Gia_Obj_t *)(&pGVar3->field_0x0 + lVar17);
          uVar16 = *(ulong *)(&pGVar3->field_0x0 + lVar17);
          uVar11 = (uint)uVar16;
          uVar13 = uVar11 & 0x1fffffff;
          uVar19 = (uint)(uVar16 >> 0x20) & 0x1fffffff;
          if ((((int)uVar11 < 0) || (uVar13 == 0x1fffffff)) || (uVar13 != uVar19)) {
            if ((pGia->pMuxes == (uint *)0x0) || (pGia->pMuxes[uVar21] == 0)) {
              bVar23 = (~uVar11 & 0x1fffffff) == 0;
              if (uVar19 <= uVar13 || (bVar23 || (int)uVar11 < 0)) {
                if (!bVar23 && (int)uVar11 >= 0) {
                  Gia_ObjSetAndLevel(pGia,pGVar1);
                }
              }
              else {
                Gia_ObjSetXorLevel(pGia,pGVar1);
              }
            }
            else {
              Gia_ObjSetMuxLevel(pGia,pGVar1);
            }
          }
          else {
            if ((uVar16 & 0x1fffffff) == 0x1fffffff) {
              __assert_fail("Gia_ObjIsAnd(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x20d,"void Gia_ObjSetBufLevel(Gia_Man_t *, Gia_Obj_t *)");
            }
            iVar12 = (int)(uVar16 & 0x1fffffff);
            pGVar15 = (Gia_Obj_t *)(lVar17 + (ulong)(uint)(iVar12 * 4) * -3 + (long)pGVar3);
            if ((pGVar15 < pGVar3) || (pGVar3 + iVar22 <= pGVar15)) {
LAB_004a6faf:
              __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
            }
            uVar11 = (int)((long)(lVar17 + (ulong)(uint)(iVar12 << 2) * -3) >> 2) * -0x55555555;
            pVVar4 = pGia->vLevels;
            Vec_IntFillExtra(pVVar4,uVar11 + 1,(int)pGVar15);
            if (((int)uVar11 < 0) || (pVVar4->nSize <= (int)uVar11)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            pGVar15 = pGia->pObjs;
            if ((pGVar1 < pGVar15) || (pGVar15 + pGia->nObjs <= pGVar1)) goto LAB_004a6faf;
            iVar22 = pVVar4->pArray[uVar11 & 0x7fffffff];
            uVar11 = (int)((long)pGVar3 + (lVar17 - (long)pGVar15) >> 2) * -0x55555555;
            pVVar4 = pGia->vLevels;
            Vec_IntFillExtra(pVVar4,uVar11 + 1,(int)pGVar1);
            if (((int)uVar11 < 0) || (pVVar4->nSize <= (int)uVar11)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            pVVar4->pArray[uVar11 & 0x7fffffff] = iVar22;
          }
          uVar21 = uVar21 + 1;
          iVar22 = pGia->nObjs;
          lVar17 = lVar17 + 0xc;
        } while ((int)uVar21 < iVar22);
      }
      m_Non1Step = m_Non1Step + 1;
    }
  }
  if ((int)uVar8 < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                  ,0x10f,"int Abc_LitNotCond(int, int)");
  }
LAB_004a6eba:
  return uVar8 ^ bVar2 == 0x21;
}

Assistant:

int Dau_DsdToGia_rec( Gia_Man_t * pGia, char * pStr, char ** p, int * pMatches, int * pLits, Vec_Int_t * vCover )
{
    int fCompl = 0;
    if ( **p == '!' )
        (*p)++, fCompl = 1;
    if ( **p >= 'a' && **p < 'a' + DAU_DSD_MAX_VAR ) // var
        return Abc_LitNotCond( pLits[**p - 'a'], fCompl );
    if ( **p == '(' ) // and/or
    {
        char * q = pStr + pMatches[ *p - pStr ];
        int pFans[DAU_DSD_MAX_VAR], nFans = 0, Fan;
        assert( **p == '(' && *q == ')' );
        for ( (*p)++; *p < q; (*p)++ )
        {
            Fan = Dau_DsdToGia_rec( pGia, pStr, p, pMatches, pLits, vCover );
            Dau_DsdAddToArray( pGia, pFans, nFans++, Fan );
        }
        Fan = Dau_DsdBalance( pGia, pFans, nFans, 1 );
        assert( *p == q );
        return Abc_LitNotCond( Fan, fCompl );
    }
    if ( **p == '[' ) // xor
    {
        char * q = pStr + pMatches[ *p - pStr ];
        int pFans[DAU_DSD_MAX_VAR], nFans = 0, Fan;
        assert( **p == '[' && *q == ']' );
        for ( (*p)++; *p < q; (*p)++ )
        {
            Fan = Dau_DsdToGia_rec( pGia, pStr, p, pMatches, pLits, vCover );
            Dau_DsdAddToArray( pGia, pFans, nFans++, Fan );
        }
        Fan = Dau_DsdBalance( pGia, pFans, nFans, 0 );
        assert( *p == q );
        return Abc_LitNotCond( Fan, fCompl );
    }
    if ( **p == '<' ) // mux
    {
        Gia_Obj_t * pObj;
        int nVars = 0;
        int Temp[3], * pTemp = Temp, Res;
        int Fanins[DAU_DSD_MAX_VAR], * pLits2;
        char * pOld = *p;
        char * q = pStr + pMatches[ *p - pStr ];
        // read fanins
        if ( *(q+1) == '{' )
        {
            char * q2;
            *p = q+1;
            q2 = pStr + pMatches[ *p - pStr ];
            assert( **p == '{' && *q2 == '}' );
            for ( nVars = 0, (*p)++; *p < q2; (*p)++, nVars++ )
                Fanins[nVars] = Dau_DsdToGia_rec( pGia, pStr, p, pMatches, pLits, vCover );
            assert( *p == q2 );
            pLits2 = Fanins;
        }
        else
            pLits2 = pLits;
        // read MUX
        *p = pOld;
        q = pStr + pMatches[ *p - pStr ];
        assert( **p == '<' && *q == '>' );
        // verify internal variables
        if ( nVars )
            for ( ; pOld < q; pOld++ )
                if ( *pOld >= 'a' && *pOld <= 'z' )
                    assert( *pOld - 'a' < nVars );
        // derive MUX components
        for ( (*p)++; *p < q; (*p)++ )
            *pTemp++ = Dau_DsdToGia_rec( pGia, pStr, p, pMatches, pLits2, vCover );
        assert( pTemp == Temp + 3 );
        assert( *p == q );
        if ( *(q+1) == '{' ) // and/or
        {
            char * q = pStr + pMatches[ ++(*p) - pStr ];
            assert( **p == '{' && *q == '}' );
            *p = q;
        }
        if ( pGia->pMuxes )
            Res = Gia_ManHashMuxReal( pGia, Temp[0], Temp[1], Temp[2] );
        else
            Res = Gia_ManHashMux( pGia, Temp[0], Temp[1], Temp[2] );
        pObj = Gia_ManObj(pGia, Abc_Lit2Var(Res));
        if ( Gia_ObjIsAnd(pObj) )
        {
            if ( pGia->pMuxes )
                Gia_ObjSetMuxLevel( pGia, pObj );
            else 
            {
                if ( Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) )
                    Gia_ObjSetAndLevel( pGia, Gia_ObjFanin0(pObj) );
                if ( Gia_ObjIsAnd(Gia_ObjFanin1(pObj)) )
                    Gia_ObjSetAndLevel( pGia, Gia_ObjFanin1(pObj) );
                Gia_ObjSetAndLevel( pGia, pObj );
            }
        }
        return Abc_LitNotCond( Res, fCompl );
    }
    if ( (**p >= 'A' && **p <= 'F') || (**p >= '0' && **p <= '9') )
    {
        Vec_Int_t vLeaves;  char * q;
        word pFunc[DAU_DSD_MAX_VAR > 6 ? (1 << (DAU_DSD_MAX_VAR-6)) : 1];
        int Fanins[DAU_DSD_MAX_VAR], Res, nObjOld; 
        int i, nVars = Abc_TtReadHex( pFunc, *p );
        *p += Abc_TtHexDigitNum( nVars );
        q = pStr + pMatches[ *p - pStr ];
        assert( **p == '{' && *q == '}' );
        for ( i = 0, (*p)++; *p < q; (*p)++, i++ )
            Fanins[i] = Dau_DsdToGia_rec( pGia, pStr, p, pMatches, pLits, vCover );
        assert( i == nVars );
        assert( *p == q );
        vLeaves.nCap = nVars;
        vLeaves.nSize = nVars;
        vLeaves.pArray = Fanins;      
        nObjOld = Gia_ManObjNum(pGia);
        Res = Kit_TruthToGia( pGia, (unsigned *)pFunc, nVars, vCover, &vLeaves, 1 );
//        assert( nVars <= 6 );
//        Res = Dau_DsdToGiaCompose_rec( pGia, pFunc[0], Fanins, nVars );
        for ( i = nObjOld; i < Gia_ManObjNum(pGia); i++ )
            Gia_ObjSetGateLevel( pGia, Gia_ManObj(pGia, i) );
        m_Non1Step++;
        return Abc_LitNotCond( Res, fCompl );
    }
    assert( 0 );
    return 0;
}